

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  secp256k1_ge *psVar8;
  secp256k1_ge *a_00;
  secp256k1_gej *a_01;
  secp256k1_fe *b;
  size_t sVar9;
  int *piVar10;
  size_t sVar11;
  secp256k1_ge *psVar12;
  bool bVar13;
  secp256k1_fe u;
  secp256k1_ge_storage sStack_b0;
  code *pcStack_70;
  secp256k1_ge *local_68;
  uint64_t local_60;
  uint64_t uStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  undefined8 uStack_38;
  
  a_01 = a;
  sVar9 = len;
  local_68 = r;
  if (len != 0) {
    do {
      pcStack_70 = (code *)0x14d7e7;
      secp256k1_gej_verify(a_01);
      sVar9 = sVar9 - 1;
      a_01 = a_01 + 1;
    } while (sVar9 != 0);
    b = &a->z;
    sVar11 = 0xffffffffffffffff;
    sVar9 = 0;
    psVar8 = local_68;
    do {
      if ((int)b[1].n[0] == 0) {
        if (sVar11 == 0xffffffffffffffff) {
          uVar2 = b->n[0];
          uVar3 = b->n[1];
          uVar4 = b->n[2];
          uVar5 = b->n[3];
          iVar6 = b->magnitude;
          iVar7 = b->normalized;
          (psVar8->x).n[4] = b->n[4];
          (psVar8->x).magnitude = iVar6;
          (psVar8->x).normalized = iVar7;
          (psVar8->x).n[2] = uVar4;
          (psVar8->x).n[3] = uVar5;
          (psVar8->x).n[0] = uVar2;
          (psVar8->x).n[1] = uVar3;
          sVar11 = sVar9;
        }
        else {
          pcStack_70 = (code *)0x14d82f;
          secp256k1_fe_mul(&psVar8->x,&local_68[sVar11].x,b);
          sVar11 = sVar9;
        }
      }
      else {
        pcStack_70 = (code *)0x14d814;
        secp256k1_ge_set_infinity(psVar8);
      }
      psVar12 = local_68;
      sVar9 = sVar9 + 1;
      psVar8 = psVar8 + 1;
      b = (secp256k1_fe *)(b[3].n + 1);
    } while (len != sVar9);
    if (sVar11 != 0xffffffffffffffff) {
      psVar8 = local_68 + sVar11;
      a_00 = (secp256k1_ge *)&stack0xffffffffffffffa0;
      pcStack_70 = (code *)0x14d887;
      secp256k1_fe_inv_var((secp256k1_fe *)a_00,&psVar8->x);
      if (sVar11 == 0) {
        sVar11 = 0;
      }
      else {
        sVar9 = sVar11 - 1;
        piVar10 = &a[sVar11 - 1].infinity;
        psVar12 = psVar12 + sVar11;
        do {
          psVar12 = psVar12 + -1;
          if (*piVar10 == 0) {
            pcStack_70 = (code *)0x14d8c5;
            secp256k1_fe_mul(&local_68[sVar11].x,&psVar12->x,
                             (secp256k1_fe *)&stack0xffffffffffffffa0);
            psVar8 = (secp256k1_ge *)&stack0xffffffffffffffa0;
            pcStack_70 = (code *)0x14d8e1;
            a_00 = psVar8;
            secp256k1_fe_mul((secp256k1_fe *)psVar8,(secp256k1_fe *)psVar8,&a[sVar11].z);
            sVar11 = sVar9;
          }
          piVar10 = piVar10 + -0x26;
          bVar13 = sVar9 != 0;
          sVar9 = sVar9 - 1;
        } while (bVar13);
      }
      psVar12 = local_68;
      if (a[sVar11].infinity != 0) {
        pcStack_70 = secp256k1_ge_from_bytes_ext;
        secp256k1_ge_set_all_gej_var_cold_1();
        sStack_b0.y.n[2] = 0;
        do {
          if (*(char *)((long)(psVar8->x).n + sStack_b0.y.n[2]) != '\0') {
            sStack_b0.x.n[0] = (psVar8->x).n[0];
            sStack_b0.x.n[1] = (psVar8->x).n[1];
            sStack_b0.x.n[2] = (psVar8->x).n[2];
            sStack_b0.x.n[3] = (psVar8->x).n[3];
            sStack_b0.y.n[0] = (psVar8->x).n[4];
            sStack_b0.y.n[1]._0_4_ = (psVar8->x).magnitude;
            sStack_b0.y.n[1]._4_4_ = (psVar8->x).normalized;
            sStack_b0.y.n[2] = (psVar8->y).n[0];
            sStack_b0.y.n[3] = (psVar8->y).n[1];
            secp256k1_ge_from_storage(a_00,&sStack_b0);
            return;
          }
          sStack_b0.y.n[2] = sStack_b0.y.n[2] + 1;
        } while (sStack_b0.y.n[2] != 0x40);
        sStack_b0.y.n[3] = len;
        pcStack_70 = (code *)sVar9;
        a_00->infinity = 1;
        (a_00->x).n[0] = 0;
        (a_00->x).n[1] = 0;
        (a_00->x).n[2] = 0;
        (a_00->x).n[3] = 0;
        *(undefined8 *)((long)(a_00->x).n + 0x1c) = 0;
        *(undefined8 *)((long)(a_00->x).n + 0x24) = 0;
        (a_00->x).normalized = 1;
        sStack_b0.y.n[1] = 0x148364;
        secp256k1_fe_verify(&a_00->x);
        *(undefined8 *)((long)(a_00->y).n + 0x1c) = 0;
        *(undefined8 *)((long)(a_00->y).n + 0x24) = 0;
        (a_00->y).n[2] = 0;
        (a_00->y).n[3] = 0;
        (a_00->y).n[0] = 0;
        (a_00->y).n[1] = 0;
        (a_00->y).normalized = 1;
        sStack_b0.y.n[1] = 0x14837f;
        secp256k1_fe_verify(&a_00->y);
        secp256k1_ge_verify(a_00);
        return;
      }
      puVar1 = local_68[sVar11].x.n + 4;
      *puVar1 = local_40;
      puVar1[1] = uStack_38;
      puVar1 = local_68[sVar11].x.n + 2;
      *puVar1 = local_50;
      puVar1[1] = uStack_48;
      local_68[sVar11].x.n[0] = local_60;
      local_68[sVar11].x.n[1] = uStack_58;
      psVar8 = local_68;
      sVar9 = len;
      if (len != 0) {
        do {
          if (a->infinity == 0) {
            pcStack_70 = (code *)0x14d957;
            secp256k1_ge_set_gej_zinv(psVar8,a,&psVar8->x);
          }
          a = a + 1;
          sVar9 = sVar9 - 1;
          psVar8 = psVar8 + 1;
        } while (sVar9 != 0);
        do {
          pcStack_70 = (code *)0x14d96f;
          secp256k1_ge_verify(psVar12);
          psVar12 = psVar12 + 1;
          len = len - 1;
        } while (len != 0);
      }
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}